

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O1

group * __thiscall
clipp::group::push_back<clipp::group,clipp::parameter>(group *this,group *param1,parameter *param2)

{
  children_store *this_00;
  
  this_00 = &this->children_;
  std::
  vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ::reserve(this_00,((long)(this->children_).
                           super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->children_).
                           super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * 0xf83e0f83e0f83e1 + 2);
  std::
  vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ::emplace_back<clipp::group>(this_00,param1);
  std::
  vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ::emplace_back<clipp::parameter>(this_00,param2);
  return this;
}

Assistant:

group&
    push_back(Param1&& param1, Param2&& param2, Params&&... params)
    {
        children_.reserve(children_.size() + 2 + sizeof...(params));
        push_back(std::forward<Param1>(param1));
        push_back(std::forward<Param2>(param2), std::forward<Params>(params)...);
        return *this;
    }